

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * dmrC_evaluate_expression(dmr_C *C,expression *expr)

{
  expression *expr_00;
  position pVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  symbol *psVar5;
  uint uVar6;
  char *pcVar7;
  symbol *psVar8;
  global_symbols_t *S;
  uint uVar9;
  symbol *sym;
  long lVar10;
  expression_list *sym_00;
  symbol *local_60;
  symbol *t1;
  symbol *local_50;
  symbol *local_48;
  symbol *local_40;
  uint local_34;
  
  if (expr == (expression *)0x0) {
    return (symbol *)0x0;
  }
  if (expr->ctype != (symbol *)0x0) {
    return expr->ctype;
  }
  switch(*(undefined1 *)expr) {
  case 1:
  case 0x1c:
    pcVar7 = "value expression without a type";
    goto LAB_0010a915;
  case 2:
    psVar5 = evaluate_string(C,expr);
    return psVar5;
  case 3:
    psVar5 = evaluate_symbol_expression(C,expr);
    return psVar5;
  case 4:
    evaluate_symbol(C,(expr->field_5).field_4.symbol);
    lVar10 = 0x3a8;
    goto LAB_0010a946;
  case 5:
    psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if ((psVar5 != (symbol *)0x0) &&
       (psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right), psVar5 != (symbol *)0x0)
       ) {
      psVar5 = evaluate_binop(C,expr);
      return psVar5;
    }
    break;
  case 6:
    psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if ((psVar5 != (symbol *)0x0) &&
       (psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right), psVar5 != (symbol *)0x0)
       ) {
      psVar5 = evaluate_assignment(C,expr);
      return psVar5;
    }
    break;
  case 7:
    psVar5 = evaluate_logical(C,expr);
    return psVar5;
  case 8:
    psVar5 = evaluate_member_dereference(C,expr);
    return psVar5;
  case 9:
    psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar5 != (symbol *)0x0) {
      psVar5 = evaluate_preop(C,expr);
      return psVar5;
    }
    break;
  case 10:
    psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if (psVar5 != (symbol *)0x0) {
      psVar5 = evaluate_postop(C,expr);
      return psVar5;
    }
    break;
  case 0xb:
  case 0xc:
  case 0xd:
    expr_00 = (expr->field_5).field_6.right;
    if (expr_00 == (expression *)0x0) {
      return (symbol *)0x0;
    }
    if (*(char *)expr_00 == '\x18') {
      pVar1 = expr->pos;
      sym_00 = (expr->field_5).expr_list;
      local_40 = (symbol *)expr_00;
      psVar5 = (symbol *)dmrC_allocator_allocate(&C->expression_allocator,0);
      *(undefined1 *)psVar5 = 3;
      *(position *)&(psVar5->pos).field_0x4 = pVar1;
      sym_00->list_[0x12] = (expression *)local_40;
      evaluate_symbol(C,(symbol *)sym_00);
      *(symbol **)&(psVar5->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
      psVar5->next_id = (symbol *)sym_00;
      *(undefined1 *)expr = 9;
      expr->op = 0x2a;
      (expr->field_5).field_4.symbol = psVar5;
      goto LAB_0010a94a;
    }
    psVar5 = dmrC_examine_symbol_type(C->S,(expr->field_5).field_4.symbol);
    expr->ctype = psVar5;
    (expr->field_5).field_4.symbol = psVar5;
    dmrC_evaluate_expression(C,expr_00);
    degenerate(C,expr_00);
    uVar2 = classify_type(C,psVar5,&local_60);
    if (((uVar2 & 9) != 1) ||
       (((*(ushort *)expr & 0xff00) == 0x100 && ((expr_00->field_0x1 & 1) == 0)))) {
      *(ushort *)expr = *(ushort *)expr & 0xff;
    }
    if (local_60 == &C->S->void_ctype) {
      return psVar5;
    }
    local_40 = local_60;
    if ((uVar2 & 0xa0) != 0) {
      dmrC_warning(C,expr->pos,"cast to non-scalar");
    }
    local_50 = expr_00->ctype;
    if (local_50 != (symbol *)0x0) {
      uVar3 = classify_type(C,local_50,&local_50);
      if ((uVar3 & 0x20) != 0) {
        local_48 = (symbol *)CONCAT44(local_48._4_4_,uVar2);
        dmrC_warning(C,expr->pos,"cast from non-scalar");
        uVar2 = (uint)local_48;
      }
      if (*(char *)expr == '\f') {
        return psVar5;
      }
      sym = local_50;
      if ((uVar3 & 0x40) != 0) {
        sym = (local_50->field_14).field_2.ctype.base_type;
      }
      if (local_40 != sym) {
        if (((uVar2 & 4) != 0) &&
           ((*(char *)expr_00 != '\x01' || ((expr_00->field_5).field_0.value != 0)))) {
          local_48 = sym;
          local_34 = uVar3;
          pcVar7 = dmrC_show_typename(C,local_40);
          dmrC_warning(C,expr->pos,"cast to %s",pcVar7);
          sym = local_48;
          uVar3 = local_34;
        }
        if (((uVar3 & 4) != 0) &&
           ((psVar8 = &C->S->bool_ctype, local_40 != psVar8 || ((uVar3 & 0x40) != 0)))) {
          pcVar7 = "%s degrades to integer";
          if (local_40 != psVar8) {
            pcVar7 = "cast from %s";
          }
          t1 = (symbol *)pcVar7;
          local_48 = sym;
          local_34 = uVar3;
          pcVar7 = dmrC_show_typename(C,sym);
          dmrC_warning(C,expr->pos,(char *)t1,pcVar7);
          sym = local_48;
          uVar3 = local_34;
        }
      }
      S = C->S;
      if (local_40 == &S->ulong_ctype) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar9 = 0;
        if (uVar2 == 0x10) {
          local_48 = (symbol *)CONCAT44(local_48._4_4_,0x10);
          local_34 = uVar3;
          dmrC_examine_pointer_target(S,local_40);
          uVar9 = *(uint *)((long)&local_40->field_14 + 0x30);
          S = C->S;
          uVar2 = (uint)local_48;
          uVar3 = local_34;
        }
      }
      if (sym == &S->ulong_ctype) goto LAB_0010ac84;
      uVar6 = 0;
      if (uVar3 == 0x10) {
        local_48 = sym;
        local_34 = uVar9;
        dmrC_examine_pointer_target(S,sym);
        uVar6 = *(uint *)((long)&local_48->field_14 + 0x30);
        if ((local_34 == 0) && (0 < (int)uVar6)) {
          dmrC_warning(C,expr->pos,"cast removes address space of expression");
          uVar9 = local_34;
          goto LAB_0010ac84;
        }
        uVar9 = local_34;
        if (((0 < (int)local_34) && (0 < (int)uVar6)) && (local_34 != uVar6)) {
          dmrC_warning(C,expr->pos,"cast between address spaces (<asn:%d>-><asn:%d>)",(ulong)uVar6,
                       (ulong)local_34);
          uVar9 = local_34;
          goto LAB_0010ac84;
        }
      }
      if ((0 < (int)uVar9) && (uVar6 == 0)) {
        local_34 = uVar9;
        iVar4 = is_null_pointer_constant(C,expr_00);
        uVar9 = local_34;
        if ((iVar4 == 0) && (C->Wcast_to_as != 0)) {
          dmrC_warning(C,expr->pos,"cast adds address space to expression (<asn:%d>)",
                       (ulong)local_34);
          uVar9 = local_34;
        }
      }
LAB_0010ac84:
      if (((uVar2 == 0x10) && (((local_40->field_14).field_2.ctype.modifiers & 0x20300030) == 0)) &&
         ((uVar9 == 0 &&
          ((((expr_00->field_0x1 & 1) != 0 &&
            ((local_40->field_14).field_2.ctype.base_type == &C->S->void_ctype)) &&
           (iVar4 = dmrC_is_zero_constant(C,expr_00), iVar4 != 0)))))) {
        *(undefined1 *)expr = 1;
        psVar5 = &C->S->null_ctype;
        expr->ctype = psVar5;
        (expr->field_5).field_0.value = 0;
        return psVar5;
      }
      if (local_40 == &C->S->bool_ctype) {
        cast_to_bool(C,expr);
        return psVar5;
      }
      return psVar5;
    }
    pcVar7 = "cast from unknown type";
    local_50 = (symbol *)0x0;
    goto LAB_0010a918;
  case 0xe:
    psVar5 = evaluate_sizeof(C,expr);
    return psVar5;
  case 0xf:
    psVar5 = evaluate_alignof(C,expr);
    return psVar5;
  case 0x10:
    psVar5 = evaluate_ptrsizeof(C,expr);
    return psVar5;
  case 0x11:
  case 0x12:
    psVar5 = evaluate_conditional_expression(C,expr);
    return psVar5;
  case 0x13:
    psVar5 = dmrC_evaluate_statement(C,(expr->field_5).statement);
    expr->ctype = psVar5;
    return psVar5;
  case 0x14:
    psVar5 = evaluate_call(C,expr);
    return psVar5;
  case 0x15:
    dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
    if (psVar5 != (symbol *)0x0) {
      psVar5 = evaluate_comma(C,expr);
      return psVar5;
    }
    break;
  case 0x16:
    psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
    if ((psVar5 != (symbol *)0x0) &&
       (psVar5 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right), psVar5 != (symbol *)0x0)
       ) {
      psVar5 = evaluate_compare(C,expr);
      return psVar5;
    }
    break;
  case 0x17:
    lVar10 = 0x1880;
LAB_0010a946:
    sym_00 = (expression_list *)((long)&C->S->C + lVar10);
LAB_0010a94a:
    expr->ctype = (symbol *)sym_00;
    return (symbol *)sym_00;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    pcVar7 = "internal front-end error: initializer in expression";
    goto LAB_0010a915;
  case 0x1d:
    pcVar7 = "internal front-end error: SLICE re-evaluated";
LAB_0010a915:
    psVar5 = (symbol *)0x0;
LAB_0010a918:
    dmrC_expression_error(C,expr,pcVar7);
    return psVar5;
  case 0x1e:
    psVar5 = evaluate_offsetof(C,expr);
    return psVar5;
  }
  return (symbol *)0x0;
}

Assistant:

struct symbol *dmrC_evaluate_expression(struct dmr_C *C, struct expression *expr)
{
	if (!expr)
		return NULL;
	if (expr->ctype)
		return expr->ctype;

	switch (expr->type) {
	case EXPR_VALUE:
	case EXPR_FVALUE:
		dmrC_expression_error(C, expr, "value expression without a type");
		return NULL;
	case EXPR_STRING:
		return evaluate_string(C, expr);
	case EXPR_SYMBOL:
		return evaluate_symbol_expression(C, expr);
	case EXPR_BINOP:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_binop(C, expr);
	case EXPR_LOGICAL:
		return evaluate_logical(C, expr);
	case EXPR_COMMA:
		dmrC_evaluate_expression(C, expr->left);
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_comma(C, expr);
	case EXPR_COMPARE:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_compare(C, expr);
	case EXPR_ASSIGNMENT:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_assignment(C, expr);
	case EXPR_PREOP:
		if (!dmrC_evaluate_expression(C, expr->unop))
			return NULL;
		return evaluate_preop(C, expr);
	case EXPR_POSTOP:
		if (!dmrC_evaluate_expression(C, expr->unop))
			return NULL;
		return evaluate_postop(C, expr);
	case EXPR_CAST:
	case EXPR_FORCE_CAST:
	case EXPR_IMPLIED_CAST:
		return evaluate_cast(C, expr);
	case EXPR_SIZEOF:
		return evaluate_sizeof(C, expr);
	case EXPR_PTRSIZEOF:
		return evaluate_ptrsizeof(C, expr);
	case EXPR_ALIGNOF:
		return evaluate_alignof(C, expr);
	case EXPR_DEREF:
		return evaluate_member_dereference(C, expr);
	case EXPR_CALL:
		return evaluate_call(C, expr);
	case EXPR_SELECT:
	case EXPR_CONDITIONAL:
		return evaluate_conditional_expression(C, expr);
	case EXPR_STATEMENT:
		expr->ctype = dmrC_evaluate_statement(C, expr->statement);
		return expr->ctype;

	case EXPR_LABEL:
		expr->ctype = &C->S->ptr_ctype;
		return &C->S->ptr_ctype;

	case EXPR_TYPE:
		/* Evaluate the type of the symbol .. */
		evaluate_symbol(C, expr->symbol);
		/* .. but the type of the _expression_ is a "type" */
		expr->ctype = &C->S->type_ctype;
		return &C->S->type_ctype;

	case EXPR_OFFSETOF:
		return evaluate_offsetof(C, expr);

	/* These can not exist as stand-alone expressions */
	case EXPR_INITIALIZER:
	case EXPR_IDENTIFIER:
	case EXPR_INDEX:
	case EXPR_POS:
		dmrC_expression_error(C, expr, "internal front-end error: initializer in expression");
		return NULL;
	case EXPR_SLICE:
		dmrC_expression_error(C, expr, "internal front-end error: SLICE re-evaluated");
		return NULL;
	}
	return NULL;
}